

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::commitSaturation(Private_Impl_Still *this)

{
  MMAL_RATIONAL_T value;
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  long *in_RDI;
  
  value.den = 100;
  value.num = (int32_t)in_RDI[0xb];
  MVar1 = mmal_port_parameter_set_rational(*(MMAL_PORT_T **)(*in_RDI + 0x20),0x1002f,value);
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)in_RDI[0xf]);
    std::operator<<(poVar2,": Failed to set saturation parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitSaturation() {
            if ( mmal_port_parameter_set_rational ( camera->control, MMAL_PARAMETER_SATURATION, ( MMAL_RATIONAL_T ) {
            saturation, 100
        } ) != MMAL_SUCCESS )
            cout << API_NAME << ": Failed to set saturation parameter.\n";
        }